

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteSwapper.h
# Opt level: O2

void Assimp::ByteSwap::Swap4(void *_szOut)

{
  undefined4 uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  undefined1 auVar6 [16];
  
  if (_szOut != (void *)0x0) {
    uVar1 = *_szOut;
    auVar6 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)
                                                  uVar1 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar1 >> 0x10),uVar1)) >>
                                                  0x20),uVar1) >> 0x18),(char)((uint)uVar1 >> 8)),
                              (ushort)(byte)uVar1) & 0xffffff00ffffff);
    auVar6 = pshuflw(auVar6,auVar6,0x1b);
    sVar2 = auVar6._0_2_;
    sVar3 = auVar6._2_2_;
    sVar4 = auVar6._4_2_;
    sVar5 = auVar6._6_2_;
    *(uint *)_szOut =
         CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar6[6] - (0xff < sVar5),
                  CONCAT12((0 < sVar4) * (sVar4 < 0x100) * auVar6[4] - (0xff < sVar4),
                           CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar6[2] - (0xff < sVar3),
                                    (0 < sVar2) * (sVar2 < 0x100) * auVar6[0] - (0xff < sVar2))));
    return;
  }
  __assert_fail("_szOut",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/ByteSwapper.h"
                ,0x5e,"static void Assimp::ByteSwap::Swap4(void *)");
}

Assistant:

static inline void Swap4(void* _szOut)
    {
        ai_assert(_szOut);

#if _MSC_VER >= 1400
        uint32_t* const szOut = reinterpret_cast<uint32_t*>(_szOut);
        *szOut = _byteswap_ulong(*szOut);
#else
        uint8_t* const szOut = reinterpret_cast<uint8_t*>(_szOut);
        std::swap(szOut[0],szOut[3]);
        std::swap(szOut[1],szOut[2]);
#endif
    }